

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_interface_block(CompilerCPP *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  char (*in_stack_fffffffffffffe70) [3];
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  string local_e8 [32];
  undefined1 local_c8 [8];
  Bitset flags;
  string buffer_name;
  uint32_t local_54;
  undefined1 local_50 [4];
  uint32_t location;
  string instance_name;
  char *lowerqual;
  char *qual;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
  qual = (char *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  lowerqual = "StageOutput";
  if (type->basetype == Void) {
    lowerqual = "StageInput";
  }
  pcVar3 = "stage_output";
  if (type->basetype == Void) {
    pcVar3 = "stage_input";
  }
  instance_name.field_2._8_8_ = pcVar3;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_50,this,(ulong)uVar2,1);
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  local_54 = (pmVar4->decoration).location;
  ::std::__cxx11::string::string((string *)&flags.higher._M_h._M_single_bucket);
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,(key_type *)(qual + 8));
  Bitset::Bitset((Bitset *)local_c8,&(pmVar4->decoration).decoration_flags);
  bVar1 = Bitset::get((Bitset *)local_c8,2);
  if (bVar1) {
    emit_block_struct(this,(SPIRType *)qual);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(qual + 8));
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_e8,this,(ulong)uVar2,1);
    ::std::__cxx11::string::operator=((string *)&flags.higher._M_h._M_single_bucket,local_e8);
    ::std::__cxx11::string::~string(local_e8);
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_108,this,qual,0);
    ::std::__cxx11::string::operator=((string *)&flags.higher._M_h._M_single_bucket,local_108);
    ::std::__cxx11::string::~string(local_108);
  }
  pcVar3 = qual;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&local_128,this,pcVar3,(ulong)uVar2);
  CompilerGLSL::
  statement<char_const(&)[11],char_const*&,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [11])"internal::",&lowerqual,(char (*) [2])0x630083
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &flags.higher._M_h._M_single_bucket,&local_128,(char (*) [3])0x681592,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [4])"__;");
  ::std::__cxx11::string::~string((string *)&local_128);
  CompilerGLSL::
  statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [9])" __res->",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [9])"__.get()");
  join<char_const(&)[12],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3]>
            (&local_148,(spirv_cross *)"s.register_",
             (char (*) [12])((long)&instance_name.field_2 + 8),(char **)0x676d60,
             (char (*) [2])local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x669987,
             (char (*) [3])0x6737c9,(char (*) [3])&local_54,(uint *)0x6815da,
             in_stack_fffffffffffffe70);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&this->resource_registrations,&local_148);
  ::std::__cxx11::string::~string((string *)&local_148);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
  Bitset::~Bitset((Bitset *)local_c8);
  ::std::__cxx11::string::~string((string *)&flags.higher._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void CompilerCPP::emit_interface_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);

	const char *qual = var.storage == StorageClassInput ? "StageInput" : "StageOutput";
	const char *lowerqual = var.storage == StorageClassInput ? "stage_input" : "stage_output";
	auto instance_name = to_name(var.self);
	uint32_t location = ir.meta[var.self].decoration.location;

	string buffer_name;
	auto flags = ir.meta[type.self].decoration.decoration_flags;
	if (flags.get(DecorationBlock))
	{
		emit_block_struct(type);
		buffer_name = to_name(type.self);
	}
	else
		buffer_name = type_to_glsl(type);

	statement("internal::", qual, "<", buffer_name, type_to_array_glsl(type, var.self), "> ", instance_name, "__;");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
	resource_registrations.push_back(join("s.register_", lowerqual, "(", instance_name, "__", ", ", location, ");"));
	statement("");
}